

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void wasm_val_copy(wasm_val_t *out,wasm_val_t *in)

{
  undefined7 uVar1;
  FILE *pFVar2;
  wasm_val_t *pwVar3;
  bool bVar4;
  undefined8 uVar5;
  TypedValue *tv;
  TypedValue *tv_00;
  wasm_ref_t *local_98;
  TypedValue local_88;
  string local_70;
  TypedValue local_50;
  string local_38;
  wasm_val_t *local_18;
  wasm_val_t *in_local;
  wasm_val_t *out_local;
  
  pFVar2 = _stderr;
  local_18 = in;
  in_local = out;
  ToWabtValue(&local_50,in);
  wabt::interp::TypedValueToString_abi_cxx11_(&local_38,(interp *)&local_50,tv);
  uVar5 = std::__cxx11::string::c_str();
  fprintf(pFVar2,"CAPI: [%s] %s\n","wasm_val_copy",uVar5);
  std::__cxx11::string::~string((string *)&local_38);
  bVar4 = wasm_valkind_is_ref(local_18->kind);
  if (bVar4) {
    in_local->kind = local_18->kind;
    if ((local_18->of).i64 == 0) {
      local_98 = (wasm_ref_t *)0x0;
    }
    else {
      local_98 = (wasm_ref_t *)operator_new(0x18);
      wasm_ref_t::wasm_ref_t(local_98,(local_18->of).ref);
    }
    (in_local->of).ref = local_98;
  }
  else {
    uVar1 = *(undefined7 *)&local_18->field_0x1;
    in_local->kind = local_18->kind;
    *(undefined7 *)&in_local->field_0x1 = uVar1;
    in_local->of = local_18->of;
  }
  pwVar3 = in_local;
  pFVar2 = _stderr;
  ToWabtValue(&local_88,in_local);
  wabt::interp::TypedValueToString_abi_cxx11_(&local_70,(interp *)&local_88,tv_00);
  uVar5 = std::__cxx11::string::c_str();
  fprintf(pFVar2,"CAPI: [%s] -> %p %s\n","wasm_val_copy",pwVar3,uVar5);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void wasm_val_copy(own wasm_val_t* out, const wasm_val_t* in) {
  TRACE("%s", TypedValueToString(ToWabtValue(*in)).c_str());
  if (wasm_valkind_is_ref(in->kind)) {
    out->kind = in->kind;
    out->of.ref = in->of.ref ? new wasm_ref_t{*in->of.ref} : nullptr;
  } else {
    *out = *in;
  }
  TRACE("-> %p %s", out, TypedValueToString(ToWabtValue(*out)).c_str());
}